

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O0

void __thiscall IfNeuron::getParameter(IfNeuron *this)

{
  string *in_RDX;
  long in_RSI;
  
  getParameter((string *)this,(IfNeuron *)(in_RSI + -8),in_RDX);
  return;
}

Assistant:

string IfNeuron::getParameter(const string& name) const
{
	stringstream param;
	if (name == "threshold")
		param << ifneuronTheta;
	else if (name=="spike-height")
		param << ifneuronSpikeHeight;
	else if (name== "membrane starting-value")
		param << ifneuronMembrane.getParameter("starting-value");
	else if (name=="membrane")
		param << ifneuronMembrane.getConfiguration();
	else if (name=="membrane integration-mode")
		param << ifneuronMembrane.getParameter("mode");
	else
		return SpikingNeuron::getParameter(name);
		
	return param.str();
}